

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O0

void __thiscall absl::debugging_internal::ElfMemImage::Init(ElfMemImage *this,void *base)

{
  long lVar1;
  Elf64_Phdr *pEVar2;
  Elf64_Phdr *pEVar3;
  Elf64_Sym *pEVar4;
  Elf64_Xword value;
  Elf64_Dyn *dynamic_entry;
  ptrdiff_t relocation;
  Elf64_Phdr *program_header;
  Elf64_Phdr *pEStack_30;
  int i;
  Elf64_Phdr *dynamic_program_header;
  int elf_class;
  char *base_as_char;
  void *base_local;
  ElfMemImage *this_local;
  
  this->ehdr_ = (Elf64_Ehdr *)0x0;
  this->dynsym_ = (Elf64_Sym *)0x0;
  this->dynstr_ = (char *)0x0;
  this->versym_ = (Elf64_Versym *)0x0;
  this->verdef_ = (Elf64_Verdef *)0x0;
  this->hash_ = (Elf64_Word *)0x0;
  this->strsize_ = 0;
  this->verdefnum_ = 0;
  this->link_base_ = 0xffffffffffffffff;
  if (base != (void *)0x0) {
    if ((((*base != '\x7f') || (*(char *)((long)base + 1) != 'E')) ||
        (*(char *)((long)base + 2) != 'L')) || (*(char *)((long)base + 3) != 'F')) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/debugging/internal/elf_mem_image.cc"
                    ,0xa9,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    if (*(char *)((long)base + 4) != '\x02') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/debugging/internal/elf_mem_image.cc"
                    ,0xae,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    if (*(char *)((long)base + 5) != '\x01') {
      if (*(char *)((long)base + 5) == '\x02') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/debugging/internal/elf_mem_image.cc"
                      ,0xbb,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
      }
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/debugging/internal/elf_mem_image.cc"
                    ,0xc1,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    this->ehdr_ = (Elf64_Ehdr *)base;
    pEStack_30 = (Elf64_Phdr *)0x0;
    for (program_header._4_4_ = 0; program_header._4_4_ < (int)(uint)this->ehdr_->e_phnum;
        program_header._4_4_ = program_header._4_4_ + 1) {
      pEVar3 = GetPhdr(this,program_header._4_4_);
      pEVar2 = pEStack_30;
      if (pEVar3->p_type == 1) {
        if (this->link_base_ == 0xffffffffffffffff) {
          this->link_base_ = pEVar3->p_vaddr;
        }
      }
      else {
        pEVar2 = pEVar3;
        if (pEVar3->p_type != 2) {
          pEVar2 = pEStack_30;
        }
      }
      pEStack_30 = pEVar2;
    }
    if ((this->link_base_ == 0xffffffffffffffff) || (pEStack_30 == (Elf64_Phdr *)0x0)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/debugging/internal/elf_mem_image.cc"
                    ,0xd6,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    for (value = (long)base + (pEStack_30->p_vaddr - this->link_base_); *(long *)value != 0;
        value = value + 0x10) {
      pEVar4 = (Elf64_Sym *)((long)base + (*(long *)(value + 8) - this->link_base_));
      lVar1 = *(long *)value;
      if (lVar1 == 4) {
        this->hash_ = (Elf64_Word *)pEVar4;
      }
      else if (lVar1 == 5) {
        this->dynstr_ = (char *)pEVar4;
      }
      else if (lVar1 == 6) {
        this->dynsym_ = pEVar4;
      }
      else if (lVar1 == 10) {
        this->strsize_ = *(size_t *)(value + 8);
      }
      else if (lVar1 == 0x6ffffff0) {
        this->versym_ = (Elf64_Versym *)pEVar4;
      }
      else if (lVar1 == 0x6ffffffc) {
        this->verdef_ = (Elf64_Verdef *)pEVar4;
      }
      else if (lVar1 == 0x6ffffffd) {
        this->verdefnum_ = *(size_t *)(value + 8);
      }
    }
    if ((((this->hash_ == (Elf64_Word *)0x0) || (this->dynsym_ == (Elf64_Sym *)0x0)) ||
        ((this->dynstr_ == (char *)0x0 ||
         (((this->versym_ == (Elf64_Versym *)0x0 || (this->verdef_ == (Elf64_Verdef *)0x0)) ||
          (this->verdefnum_ == 0)))))) || (this->strsize_ == 0)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/debugging/internal/elf_mem_image.cc"
                    ,0xff,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
  }
  return;
}

Assistant:

void ElfMemImage::Init(const void *base) {
  ehdr_      = nullptr;
  dynsym_    = nullptr;
  dynstr_    = nullptr;
  versym_    = nullptr;
  verdef_    = nullptr;
  hash_      = nullptr;
  strsize_   = 0;
  verdefnum_ = 0;
  link_base_ = ~0L;  // Sentinel: PT_LOAD .p_vaddr can't possibly be this.
  if (!base) {
    return;
  }
  const char *const base_as_char = reinterpret_cast<const char *>(base);
  if (base_as_char[EI_MAG0] != ELFMAG0 || base_as_char[EI_MAG1] != ELFMAG1 ||
      base_as_char[EI_MAG2] != ELFMAG2 || base_as_char[EI_MAG3] != ELFMAG3) {
    assert(false);
    return;
  }
  int elf_class = base_as_char[EI_CLASS];
  if (elf_class != kElfClass) {
    assert(false);
    return;
  }
  switch (base_as_char[EI_DATA]) {
    case ELFDATA2LSB: {
#ifndef ABSL_IS_LITTLE_ENDIAN
      assert(false);
      return;
#endif
      break;
    }
    case ELFDATA2MSB: {
#ifndef ABSL_IS_BIG_ENDIAN
      assert(false);
      return;
#endif
      break;
    }
    default: {
      assert(false);
      return;
    }
  }

  ehdr_ = reinterpret_cast<const ElfW(Ehdr) *>(base);
  const ElfW(Phdr) *dynamic_program_header = nullptr;
  for (int i = 0; i < ehdr_->e_phnum; ++i) {
    const ElfW(Phdr) *const program_header = GetPhdr(i);
    switch (program_header->p_type) {
      case PT_LOAD:
        if (!~link_base_) {
          link_base_ = program_header->p_vaddr;
        }
        break;
      case PT_DYNAMIC:
        dynamic_program_header = program_header;
        break;
    }
  }
  if (!~link_base_ || !dynamic_program_header) {
    assert(false);
    // Mark this image as not present. Can not recur infinitely.
    Init(nullptr);
    return;
  }
  ptrdiff_t relocation =
      base_as_char - reinterpret_cast<const char *>(link_base_);
  ElfW(Dyn) *dynamic_entry =
      reinterpret_cast<ElfW(Dyn) *>(dynamic_program_header->p_vaddr +
                                    relocation);
  for (; dynamic_entry->d_tag != DT_NULL; ++dynamic_entry) {
    const auto value = dynamic_entry->d_un.d_val + relocation;
    switch (dynamic_entry->d_tag) {
      case DT_HASH:
        hash_ = reinterpret_cast<ElfW(Word) *>(value);
        break;
      case DT_SYMTAB:
        dynsym_ = reinterpret_cast<ElfW(Sym) *>(value);
        break;
      case DT_STRTAB:
        dynstr_ = reinterpret_cast<const char *>(value);
        break;
      case DT_VERSYM:
        versym_ = reinterpret_cast<ElfW(Versym) *>(value);
        break;
      case DT_VERDEF:
        verdef_ = reinterpret_cast<ElfW(Verdef) *>(value);
        break;
      case DT_VERDEFNUM:
        verdefnum_ = dynamic_entry->d_un.d_val;
        break;
      case DT_STRSZ:
        strsize_ = dynamic_entry->d_un.d_val;
        break;
      default:
        // Unrecognized entries explicitly ignored.
        break;
    }
  }
  if (!hash_ || !dynsym_ || !dynstr_ || !versym_ ||
      !verdef_ || !verdefnum_ || !strsize_) {
    assert(false);  // invalid VDSO
    // Mark this image as not present. Can not recur infinitely.
    Init(nullptr);
    return;
  }
}